

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.cpp
# Opt level: O2

int mbedtls_pk_parse_public_key(mbedtls_pk_context *ctx,uchar *key,size_t keylen)

{
  mbedtls_pk_context pk;
  mbedtls_pk_context pk_00;
  int iVar1;
  mbedtls_pk_info_t *pmVar2;
  mbedtls_rsa_context *pmVar3;
  mbedtls_pk_info_t *in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  uchar *p;
  mbedtls_pem_context pem;
  size_t len;
  
  if (keylen == 0) {
    return -0x3d00;
  }
  mbedtls_pem_init(&pem);
  if (key[keylen - 1] == '\0') {
    pmVar2 = (mbedtls_pk_info_t *)&len;
    in_stack_ffffffffffffff98 = pmVar2;
    iVar1 = mbedtls_pem_read_buffer
                      (&pem,"-----BEGIN RSA PUBLIC KEY-----","-----END RSA PUBLIC KEY-----",key,
                       (uchar *)0x0,0,(size_t *)pmVar2);
    if (iVar1 == -0x1080) {
      if (((key + keylen)[-1] != '\0') ||
         (iVar1 = mbedtls_pem_read_buffer
                            (&pem,"-----BEGIN PUBLIC KEY-----","-----END PUBLIC KEY-----",key,
                             (uchar *)0x0,0,(size_t *)pmVar2), in_stack_ffffffffffffff98 = pmVar2,
         iVar1 == -0x1080)) goto LAB_0037c5cd;
      if (iVar1 == 0) {
        p = pem.buf;
        iVar1 = mbedtls_pk_parse_subpubkey(&p,pem.buf + pem.buflen,ctx);
      }
    }
    else if (iVar1 == 0) {
      p = pem.buf;
      pmVar2 = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
      if (pmVar2 == (mbedtls_pk_info_t *)0x0) {
        mbedtls_pem_free(&pem);
        goto LAB_0037c746;
      }
      iVar1 = mbedtls_pk_setup(ctx,pmVar2);
      if (iVar1 == 0) {
        pk_00.pk_ctx = in_stack_ffffffffffffffa0;
        pk_00.pk_info = in_stack_ffffffffffffff98;
        pmVar3 = mbedtls_pk_rsa(pk_00);
        iVar1 = mbedtls_rsa_parse_pubkey(pmVar3,p,pem.buflen);
        if (iVar1 != 0) {
          mbedtls_pk_free(ctx);
        }
      }
    }
    mbedtls_pem_free(&pem);
  }
  else {
LAB_0037c5cd:
    mbedtls_pem_free(&pem);
    pmVar2 = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
    if (pmVar2 != (mbedtls_pk_info_t *)0x0) {
      iVar1 = mbedtls_pk_setup(ctx,pmVar2);
      if (iVar1 != 0) {
        return iVar1;
      }
      pk.pk_ctx = in_stack_ffffffffffffffa0;
      pk.pk_info = in_stack_ffffffffffffff98;
      p = key;
      pmVar3 = mbedtls_pk_rsa(pk);
      iVar1 = mbedtls_rsa_parse_pubkey(pmVar3,p,keylen);
      if (iVar1 != 0) {
        mbedtls_pk_free(ctx);
        if (iVar1 != -0x62) {
          return iVar1;
        }
        p = key;
        iVar1 = mbedtls_pk_parse_subpubkey(&p,key + keylen,ctx);
        return iVar1;
      }
      return 0;
    }
LAB_0037c746:
    iVar1 = -0x3c80;
  }
  return iVar1;
}

Assistant:

int mbedtls_pk_parse_public_key(mbedtls_pk_context *ctx,
                                const unsigned char *key, size_t keylen)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *p;
#if defined(MBEDTLS_RSA_C)
    const mbedtls_pk_info_t *pk_info;
#endif
#if defined(MBEDTLS_PEM_PARSE_C)
    size_t len;
    mbedtls_pem_context pem;
#endif

    if (keylen == 0) {
        return MBEDTLS_ERR_PK_KEY_INVALID_FORMAT;
    }

#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_init(&pem);
#if defined(MBEDTLS_RSA_C)
    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if (key[keylen - 1] != '\0') {
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    } else {
        ret = mbedtls_pem_read_buffer(&pem,
                                      PEM_BEGIN_PUBLIC_KEY_RSA, PEM_END_PUBLIC_KEY_RSA,
                                      key, NULL, 0, &len);
    }

    if (ret == 0) {
        p = pem.buf;
        if ((pk_info = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA)) == NULL) {
            mbedtls_pem_free(&pem);
            return MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;
        }

        if ((ret = mbedtls_pk_setup(ctx, pk_info)) != 0) {
            mbedtls_pem_free(&pem);
            return ret;
        }

        if ((ret = mbedtls_rsa_parse_pubkey(mbedtls_pk_rsa(*ctx), p, pem.buflen)) != 0) {
            mbedtls_pk_free(ctx);
        }

        mbedtls_pem_free(&pem);
        return ret;
    } else if (ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT) {
        mbedtls_pem_free(&pem);
        return ret;
    }
#endif /* MBEDTLS_RSA_C */

    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if (key[keylen - 1] != '\0') {
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    } else {
        ret = mbedtls_pem_read_buffer(&pem,
                                      PEM_BEGIN_PUBLIC_KEY, PEM_END_PUBLIC_KEY,
                                      key, NULL, 0, &len);
    }

    if (ret == 0) {
        /*
         * Was PEM encoded
         */
        p = pem.buf;

        ret = mbedtls_pk_parse_subpubkey(&p, p + pem.buflen, ctx);
        mbedtls_pem_free(&pem);
        return ret;
    } else if (ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT) {
        mbedtls_pem_free(&pem);
        return ret;
    }
    mbedtls_pem_free(&pem);
#endif /* MBEDTLS_PEM_PARSE_C */

#if defined(MBEDTLS_RSA_C)
    if ((pk_info = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA)) == NULL) {
        return MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;
    }

    if ((ret = mbedtls_pk_setup(ctx, pk_info)) != 0) {
        return ret;
    }

    p = (unsigned char *) key;
    ret = mbedtls_rsa_parse_pubkey(mbedtls_pk_rsa(*ctx), p, keylen);
    if (ret == 0) {
        return ret;
    }
    mbedtls_pk_free(ctx);
    if (ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG) {
        return ret;
    }
#endif /* MBEDTLS_RSA_C */
    p = (unsigned char *) key;

    ret = mbedtls_pk_parse_subpubkey(&p, p + keylen, ctx);

    return ret;
}